

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineInputAssemblyTests.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::anon_unknown_0::PrimitiveRestartTest::createBufferData
          (PrimitiveRestartTest *this,VkPrimitiveTopology topology,int primitiveCount,
          VkIndexType indexType,vector<unsigned_int,_std::allocator<unsigned_int>_> *indexData,
          vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          *vertexData)

{
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var1;
  int iVar2;
  uint uVar3;
  float fVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  float fVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  uint local_10c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_108;
  float local_f0;
  float local_ec;
  value_type local_e8;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> local_c8;
  undefined1 local_a8 [16];
  float local_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_68;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *local_60;
  value_type local_58;
  
  local_58.position.m_data[0] = -1.0;
  local_58.position.m_data[1] = -1.0;
  local_58.position.m_data[2] = 0.0;
  local_58.position.m_data[3] = 1.0;
  local_58.color.m_data[0] = 0.0;
  local_58.color.m_data[1] = 1.0;
  local_58.color.m_data[2] = 0.0;
  local_58.color.m_data[3] = 1.0;
  local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_c8.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8 = ZEXT816(0);
  local_f0 = (float)primitiveCount;
  local_68 = indexData;
  local_60 = vertexData;
  switch(topology - VK_PRIMITIVE_TOPOLOGY_LINE_STRIP) {
  case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
    iVar2 = primitiveCount / 2;
    break;
  default:
    goto switchD_004f262b_caseD_1;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
    iVar2 = primitiveCount - primitiveCount / 2;
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
    local_a8._0_12_ = ZEXT812(0x3f4ccccd);
    local_a8._12_4_ = 0;
    local_78._0_4_ = 0x3f4ccccd;
    goto LAB_004f289a;
  }
  local_a8 = ZEXT416((uint)(1.6 / (float)iVar2));
switchD_004f262b_caseD_1:
  switch(topology - VK_PRIMITIVE_TOPOLOGY_LINE_STRIP) {
  case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
    if (0 < primitiveCount) {
      fVar4 = 0.0;
      bVar8 = true;
      do {
        local_e8.position.m_data[0] = fVar4;
        _Var1 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          ((this->m_restartPrimitives).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (this->m_restartPrimitives).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_e8);
        bVar7 = _Var1._M_current ==
                (this->m_restartPrimitives).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
        if (bVar7) {
          if (bVar8) {
            local_e8.position.m_data[1] = (float)((uint)fVar4 & 1) * 1.6 + -0.8;
            local_e8.position.m_data[0] = (float)((uint)fVar4 >> 1) * (float)local_a8._0_4_ + -0.8;
            local_e8.position.m_data[2] = 0.0;
            local_e8.position.m_data[3] = 1.0;
            local_e8.color.m_data[0] = 1.0;
            local_e8.color.m_data[1] = 0.0;
            local_e8.color.m_data[2] = 0.0;
            local_e8.color.m_data[3] = 1.0;
            std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
            push_back(&local_c8,&local_e8);
            local_10c = (int)((ulong)((long)local_c8.
                                            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_c8.
                                           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
            if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_108,
                         (iterator)
                         local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_10c);
            }
            else {
              *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_10c;
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
          }
          local_e8.position.m_data[1] = (float)((int)fVar4 + 1U & 1) * 1.6 + -0.8;
          local_e8.position.m_data[0] = (float)((int)fVar4 + 1U >> 1) * (float)local_a8._0_4_ + -0.8
          ;
          local_e8.position.m_data[2] = 0.0;
          local_e8.position.m_data[3] = 1.0;
          local_e8.color.m_data[0] = 1.0;
          local_e8.color.m_data[1] = 0.0;
          local_e8.color.m_data[2] = 0.0;
          local_e8.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_c8,&local_e8);
          local_10c = (int)((ulong)((long)local_c8.
                                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_c8.
                                         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_10c);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_10c;
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          local_e8.position.m_data._0_8_ =
               CONCAT44(local_e8.position.m_data[1],-(uint)(indexType != VK_INDEX_TYPE_UINT16)) |
               0xffff;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_e8);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = -(uint)(indexType != VK_INDEX_TYPE_UINT16) | 0xffff
            ;
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        fVar4 = (float)((int)fVar4 + 1);
        bVar8 = !bVar7;
      } while (fVar4 != local_f0);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
    if (0 < primitiveCount) {
      fVar4 = 0.0;
      local_ec = (float)(-(uint)(indexType != VK_INDEX_TYPE_UINT16) | 0xffff);
      local_88._4_4_ = 0x3fcccccd;
      local_88._0_4_ = local_a8._0_4_;
      local_88._8_8_ = 0;
      bVar8 = true;
      do {
        local_e8.position.m_data[0] = fVar4;
        _Var1 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          ((this->m_restartPrimitives).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (this->m_restartPrimitives).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_e8);
        bVar7 = _Var1._M_current ==
                (this->m_restartPrimitives).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
        if (bVar7) {
          if (bVar8) {
            iVar2 = 0;
            bVar8 = true;
            do {
              bVar5 = bVar8;
              local_e8.position.m_data[1] = (float)(iVar2 + (int)fVar4 & 1) * 1.6 + -0.8;
              local_e8.position.m_data[0] =
                   (float)((uint)(iVar2 + (int)fVar4) >> 1) * (float)local_a8._0_4_ + -0.8;
              local_e8.position.m_data[2] = 0.0;
              local_e8.position.m_data[3] = 1.0;
              local_e8.color.m_data[0] = 1.0;
              local_e8.color.m_data[1] = 0.0;
              local_e8.color.m_data[2] = 0.0;
              local_e8.color.m_data[3] = 1.0;
              std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
              push_back(&local_c8,&local_e8);
              local_10c = (int)((ulong)((long)local_c8.
                                              super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_c8.
                                             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
              if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          (&local_108,
                           (iterator)
                           local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_10c);
              }
              else {
                *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_10c;
                local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              iVar2 = 1;
              bVar8 = false;
            } while (bVar5);
          }
          uVar3 = ((int)fVar4 - ((int)((int)fVar4 + 2U) >> 0x1f)) + 2;
          local_e8.position.m_data._0_8_ =
               CONCAT44((float)(int)(((int)fVar4 + 2U) - (uVar3 & 0xfffffffe)) *
                        (float)local_88._4_4_ + -0.8,
                        (float)((int)uVar3 >> 1) * (float)local_88._0_4_ + -0.8);
          local_e8.position.m_data[2] = 0.0;
          local_e8.position.m_data[3] = 1.0;
          local_e8.color.m_data[0] = 1.0;
          local_e8.color.m_data[1] = 0.0;
          local_e8.color.m_data[2] = 0.0;
          local_e8.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_c8,&local_e8);
          local_10c = (int)((ulong)((long)local_c8.
                                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_c8.
                                         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_10c;
            goto LAB_004f2cf3;
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_108,
                     (iterator)
                     local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_10c);
        }
        else {
          local_e8.position.m_data[0] = local_ec;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_e8);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (uint)local_ec;
LAB_004f2cf3:
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        fVar4 = (float)((int)fVar4 + 1);
        bVar8 = !bVar7;
      } while (fVar4 != local_f0);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
    local_78._0_4_ = 0x3fcccccd;
LAB_004f289a:
    if (0 < primitiveCount) {
      local_8c = 1.5707964;
      if (6.2831855 / (float)primitiveCount <= 1.5707964) {
        local_8c = 6.2831855 / (float)primitiveCount;
      }
      fVar4 = 0.0;
      bVar8 = true;
      do {
        local_e8.position.m_data[0] = fVar4;
        _Var1 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          ((this->m_restartPrimitives).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (this->m_restartPrimitives).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_e8);
        bVar7 = _Var1._M_current ==
                (this->m_restartPrimitives).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
        if (bVar7) {
          if (bVar8) {
            local_e8.position.m_data[0] = 0.0;
            local_e8.position.m_data[1] = 0.0;
            local_e8.position.m_data[2] = 0.0;
            local_e8.position.m_data[3] = 1.0;
            local_e8.color.m_data[0] = 1.0;
            local_e8.color.m_data[1] = 0.0;
            local_e8.color.m_data[2] = 0.0;
            local_e8.color.m_data[3] = 1.0;
            std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
            push_back(&local_c8,&local_e8);
            local_10c = (int)((ulong)((long)local_c8.
                                            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_c8.
                                           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
            if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_108,
                         (iterator)
                         local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_10c);
            }
            else {
              *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_10c;
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            local_88._0_4_ = (float)(int)fVar4 * local_8c;
            local_ec = cosf((float)(int)fVar4 * local_8c);
            local_e8.position.m_data[1] = sinf((float)local_88._0_4_);
            local_e8.position.m_data[0] = local_ec * (float)local_a8._0_4_;
            local_e8.position.m_data[1] = local_e8.position.m_data[1] * (float)local_78._0_4_;
            local_e8.position.m_data[2] = 0.0;
            local_e8.position.m_data[3] = 1.0;
            std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
            push_back(&local_c8,&local_e8);
            local_10c = (int)((ulong)((long)local_c8.
                                            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_c8.
                                           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
            if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_108,
                         (iterator)
                         local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_10c);
            }
            else {
              *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_10c;
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
          }
          fVar9 = (float)(int)((int)fVar4 + 1) * local_8c;
          local_88._0_4_ = fVar9;
          local_ec = cosf(fVar9);
          fVar9 = sinf((float)local_88._0_4_);
          local_e8.position.m_data[1] = fVar9 * (float)local_78._0_4_;
          local_e8.position.m_data[0] = local_ec * (float)local_a8._0_4_;
          local_e8.position.m_data[2] = 0.0;
          local_e8.position.m_data[3] = 1.0;
          local_e8.color.m_data[0] = 1.0;
          local_e8.color.m_data[1] = 0.0;
          local_e8.color.m_data[2] = 0.0;
          local_e8.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_c8,&local_e8);
          local_10c = (int)((ulong)((long)local_c8.
                                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_c8.
                                         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_10c);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_10c;
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          local_e8.position.m_data._0_8_ =
               CONCAT44(local_e8.position.m_data[1],-(uint)(indexType != VK_INDEX_TYPE_UINT16)) |
               0xffff;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_e8);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = -(uint)(indexType != VK_INDEX_TYPE_UINT16) | 0xffff
            ;
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        fVar4 = (float)((int)fVar4 + 1);
        bVar8 = !bVar7;
      } while (fVar4 != local_f0);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (&local_c8,&local_58);
    if (0 < (int)local_f0) {
      fVar4 = 0.0;
      bVar8 = true;
      do {
        local_e8.position.m_data[0] = fVar4;
        _Var1 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          ((this->m_restartPrimitives).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (this->m_restartPrimitives).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_e8);
        bVar7 = _Var1._M_current ==
                (this->m_restartPrimitives).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
        if (bVar7) {
          if (bVar8) {
            local_e8.position.m_data._0_8_ = (ulong)(uint)local_e8.position.m_data[1] << 0x20;
            if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_108,
                         (iterator)
                         local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_e8);
            }
            else {
              *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = 0;
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            local_e8.position.m_data[1] = (float)((uint)fVar4 & 1) * 1.6 + -0.8;
            local_e8.position.m_data[0] = (float)((uint)fVar4 >> 1) * (float)local_a8._0_4_ + -0.8;
            local_e8.position.m_data[2] = 0.0;
            local_e8.position.m_data[3] = 1.0;
            local_e8.color.m_data[0] = 1.0;
            local_e8.color.m_data[1] = 0.0;
            local_e8.color.m_data[2] = 0.0;
            local_e8.color.m_data[3] = 1.0;
            std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
            push_back(&local_c8,&local_e8);
            local_10c = (int)((ulong)((long)local_c8.
                                            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_c8.
                                           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
            if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_108,
                         (iterator)
                         local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_10c);
            }
            else {
              *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_10c;
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
          }
          local_e8.position.m_data[1] = (float)((int)fVar4 + 1U & 1) * 1.6 + -0.8;
          local_e8.position.m_data[0] = (float)((int)fVar4 + 1U >> 1) * (float)local_a8._0_4_ + -0.8
          ;
          local_e8.position.m_data[2] = 0.0;
          local_e8.position.m_data[3] = 1.0;
          local_e8.color.m_data[0] = 1.0;
          local_e8.color.m_data[1] = 0.0;
          local_e8.color.m_data[2] = 0.0;
          local_e8.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_c8,&local_e8);
          local_10c = (int)((ulong)((long)local_c8.
                                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_c8.
                                         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_10c);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_10c;
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          local_e8.position.m_data._0_8_ = (ulong)(uint)local_e8.position.m_data[1] << 0x20;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_e8);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 0;
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_e8.position.m_data._0_8_ =
               CONCAT44(local_e8.position.m_data[1],-(uint)(indexType != VK_INDEX_TYPE_UINT16)) |
               0xffff;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_e8);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = -(uint)(indexType != VK_INDEX_TYPE_UINT16) | 0xffff
            ;
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        fVar4 = (float)((int)fVar4 + 1);
        bVar8 = !bVar7;
      } while (fVar4 != local_f0);
    }
    local_e8.position.m_data._0_8_ = (ulong)(uint)local_e8.position.m_data[1] << 0x20;
    if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_108,
                 (iterator)
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_e8);
    }
    else {
      *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 0;
      local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (&local_c8,&local_58);
    if (0 < (int)local_f0) {
      fVar4 = 0.0;
      local_88._0_4_ = -(uint)(indexType != VK_INDEX_TYPE_UINT16) | 0xffff;
      local_78._4_4_ = 0x3fcccccd;
      local_78._0_4_ = local_a8._0_4_;
      local_78._8_8_ = 0;
      bVar6 = 1;
      do {
        local_e8.position.m_data[0] = fVar4;
        _Var1 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          ((this->m_restartPrimitives).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (this->m_restartPrimitives).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_e8);
        bVar8 = _Var1._M_current ==
                (this->m_restartPrimitives).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
        local_ec = (float)CONCAT31(local_ec._1_3_,!bVar8);
        if (bVar8) {
          if ((bVar6 & 1) != 0) {
            iVar2 = 0;
            bVar8 = true;
            do {
              bVar7 = bVar8;
              local_e8.position.m_data[1] = (float)(iVar2 + (int)fVar4 & 1) * 1.6 + -0.8;
              local_e8.position.m_data[0] =
                   (float)((uint)(iVar2 + (int)fVar4) >> 1) * (float)local_a8._0_4_ + -0.8;
              local_e8.position.m_data[2] = 0.0;
              local_e8.position.m_data[3] = 1.0;
              local_e8.color.m_data[0] = 1.0;
              local_e8.color.m_data[1] = 0.0;
              local_e8.color.m_data[2] = 0.0;
              local_e8.color.m_data[3] = 1.0;
              std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
              push_back(&local_c8,&local_e8);
              local_10c = (int)((ulong)((long)local_c8.
                                              super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_c8.
                                             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
              if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          (&local_108,
                           (iterator)
                           local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_10c);
              }
              else {
                *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_10c;
                local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              local_10c = 0;
              if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          (&local_108,
                           (iterator)
                           local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_10c);
              }
              else {
                *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = 0;
                local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              iVar2 = 1;
              bVar8 = false;
            } while (bVar7);
          }
          uVar3 = ((int)fVar4 - ((int)((int)fVar4 + 2U) >> 0x1f)) + 2;
          local_e8.position.m_data._0_8_ =
               CONCAT44((float)(int)(((int)fVar4 + 2U) - (uVar3 & 0xfffffffe)) *
                        (float)local_78._4_4_ + -0.8,
                        (float)((int)uVar3 >> 1) * (float)local_78._0_4_ + -0.8);
          local_e8.position.m_data[2] = 0.0;
          local_e8.position.m_data[3] = 1.0;
          local_e8.color.m_data[0] = 1.0;
          local_e8.color.m_data[1] = 0.0;
          local_e8.color.m_data[2] = 0.0;
          local_e8.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_c8,&local_e8);
          local_10c = (int)((ulong)((long)local_c8.
                                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_c8.
                                         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_10c);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_10c;
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_10c = 0;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 0;
            goto LAB_004f3223;
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_108,
                     (iterator)
                     local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_10c);
        }
        else {
          local_e8.position.m_data[0] = (float)local_88._0_4_;
          if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_e8);
          }
          else {
            *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_88._0_4_;
LAB_004f3223:
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        fVar4 = (float)((int)fVar4 + 1);
        bVar6 = local_ec._0_1_;
      } while (fVar4 != local_f0);
    }
  }
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::operator=
            (local_60,&local_c8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(local_68,&local_108);
  if (local_c8.
      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrimitiveRestartTest::createBufferData (VkPrimitiveTopology topology, int primitiveCount, VkIndexType indexType, std::vector<deUint32>& indexData, std::vector<Vertex4RGBA>& vertexData) const
{
	DE_ASSERT(primitiveCount > 0);
	DE_UNREF(indexType);

	const tcu::Vec4				red						(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4				green					(0.0f, 1.0f, 0.0f, 1.0f);
	const float					border					= 0.2f;
	const float					originX					= -1.0f + border;
	const float					originY					= -1.0f + border;
	const Vertex4RGBA			defaultVertex			= { tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f), green };
	float						primitiveSizeY			= (2.0f - 2.0f * border);
	float						primitiveSizeX;
	bool						primitiveStart			= true;
	std::vector<deUint32>		indices;
	std::vector<Vertex4RGBA>	vertices;


	// Calculate primitive size
	switch (topology)
	{
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount / 2);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount / 2 + primitiveCount % 2);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
			primitiveSizeX = 1.0f - border;
			primitiveSizeY = 1.0f - border;
			break;

		default:
			primitiveSizeX = 0.0f; // Garbage
			DE_ASSERT(false);
	}

	switch (topology)
	{
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (isRestartPrimitive(primitiveNdx))
				{
					indices.push_back(InputAssemblyTest::getRestartIndex(indexType));
					primitiveStart = true;
				}
				else
				{
					if (primitiveStart)
					{
						const Vertex4RGBA vertex =
						{
							tcu::Vec4(originX + float(primitiveNdx / 2) * primitiveSizeX, originY + float(primitiveNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
							red
						};

						vertices.push_back(vertex);
						indices.push_back((deUint32)vertices.size() - 1);

						primitiveStart = false;
					}

					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 1) / 2) * primitiveSizeX, originY + float((primitiveNdx + 1) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((deUint32)vertices.size() - 1);
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
		{
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (isRestartPrimitive(primitiveNdx))
				{
					indices.push_back(InputAssemblyTest::getRestartIndex(indexType));
					primitiveStart = true;
				}
				else
				{
					if (primitiveStart)
					{
						for (int vertexNdx = 0; vertexNdx < 2; vertexNdx++)
						{
							const Vertex4RGBA vertex =
							{
								tcu::Vec4(originX + float((primitiveNdx + vertexNdx) / 2) * primitiveSizeX, originY + float((primitiveNdx + vertexNdx) % 2) * primitiveSizeY, 0.0f, 1.0f),
								red
							};

							vertices.push_back(vertex);
							indices.push_back((deUint32)vertices.size() - 1);
						}

						primitiveStart = false;
					}
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 2) / 2) * primitiveSizeX, originY + float((primitiveNdx + 2) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((deUint32)vertices.size() - 1);
				}
			}
			break;
		}

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
		{
			const float stepAngle = de::min(DE_PI * 0.5f, (2 * DE_PI) / float(primitiveCount));

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (isRestartPrimitive(primitiveNdx))
				{
					indices.push_back(InputAssemblyTest::getRestartIndex(indexType));
					primitiveStart = true;
				}
				else
				{
					if (primitiveStart)
					{
						Vertex4RGBA vertex =
						{
							tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
							red
						};

						vertices.push_back(vertex);
						indices.push_back((deUint32)vertices.size() - 1);

						vertex.position = tcu::Vec4(primitiveSizeX * deFloatCos(stepAngle * float(primitiveNdx)), primitiveSizeY * deFloatSin(stepAngle * float(primitiveNdx)), 0.0f, 1.0f),
						vertices.push_back(vertex);
						indices.push_back((deUint32)vertices.size() - 1);

						primitiveStart = false;
					}

					const Vertex4RGBA vertex =
					{
						tcu::Vec4(primitiveSizeX * deFloatCos(stepAngle * float(primitiveNdx + 1)), primitiveSizeY * deFloatSin(stepAngle * float(primitiveNdx + 1)), 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((deUint32)vertices.size() - 1);
				}
			}
			break;
		}

		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (isRestartPrimitive(primitiveNdx))
				{
					indices.push_back(0);
					indices.push_back(InputAssemblyTest::getRestartIndex(indexType));
					primitiveStart = true;
				}
				else
				{
					if (primitiveStart)
					{
						indices.push_back(0);

						const Vertex4RGBA vertex =
						{
							tcu::Vec4(originX + float(primitiveNdx / 2) * primitiveSizeX, originY + float(primitiveNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
							red
						};

						vertices.push_back(vertex);
						indices.push_back((deUint32)vertices.size() - 1);

						primitiveStart = false;
					}

					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 1) / 2) * primitiveSizeX, originY + float((primitiveNdx + 1) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((deUint32)vertices.size() - 1);
				}
			}

			indices.push_back(0);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (isRestartPrimitive(primitiveNdx))
				{
					indices.push_back(InputAssemblyTest::getRestartIndex(indexType));
					primitiveStart = true;
				}
				else
				{
					if (primitiveStart)
					{
						for (int vertexNdx = 0; vertexNdx < 2; vertexNdx++)
						{
							const Vertex4RGBA vertex =
							{
								tcu::Vec4(originX + float((primitiveNdx + vertexNdx) / 2) * primitiveSizeX, originY + float((primitiveNdx + vertexNdx) % 2) * primitiveSizeY, 0.0f, 1.0f),
								red
							};

							vertices.push_back(vertex);
							indices.push_back((deUint32)vertices.size() - 1);
							indices.push_back(0);
						}

						primitiveStart = false;
					}

					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 2) / 2) * primitiveSizeX, originY + float((primitiveNdx + 2) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((deUint32)vertices.size() - 1);
					indices.push_back(0);
				}
			}
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	vertexData	= vertices;
	indexData	= indices;
}